

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O3

CaseInsensitiveMultimap * __thiscall
SimpleWeb::HttpHeader::parse_abi_cxx11_
          (CaseInsensitiveMultimap *__return_storage_ptr__,HttpHeader *this,istream *stream)

{
  long lVar1;
  char cVar2;
  istream *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  string line;
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)this,(string *)&local_90,cVar2);
    if ((((&piVar3->field_0x20)[(long)piVar3->_vptr_basic_istream[-3]] & 5) != 0) ||
       (uVar4 = std::__cxx11::string::find((char)(string *)&local_90,0x3a),
       uVar4 == 0xffffffffffffffff)) {
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
      }
      return __return_storage_ptr__;
    }
    uVar5 = uVar4 + 2;
    if (uVar4 + 2 < local_88) {
      uVar5 = local_88;
    }
    do {
      uVar6 = uVar5 - 1;
      if (local_88 <= uVar4 + 2) break;
      uVar6 = uVar4 + 1;
      lVar1 = uVar4 + 1;
      uVar4 = uVar6;
    } while (local_90[lVar1] == ' ');
    if (uVar6 < local_88) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
      std::__cxx11::string::substr((ulong)local_70,(ulong)&local_90);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<std::__cxx11::string,std::__cxx11::string>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)__return_storage_ptr__,0,local_50,local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  } while( true );
}

Assistant:

static CaseInsensitiveMultimap parse(std::istream &stream) noexcept {
      CaseInsensitiveMultimap result;
      std::string line;
      std::size_t param_end;
      while(getline(stream, line) && (param_end = line.find(':')) != std::string::npos) {
        std::size_t value_start = param_end + 1;
        while(value_start + 1 < line.size() && line[value_start] == ' ')
          ++value_start;
        if(value_start < line.size())
          result.emplace(line.substr(0, param_end), line.substr(value_start, line.size() - value_start - (line.back() == '\r' ? 1 : 0)));
      }
      return result;
    }